

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
          (anon_unknown_0 *this,NegativeTestContext *ctx,ShaderType shaderType,string shaderSource,
          ExpectResult expect)

{
  ostringstream *this_00;
  TestLog *log;
  undefined4 in_register_00000014;
  int in_R8D;
  char *source;
  Shader shader;
  string local_248;
  ExpectResult local_224;
  char *local_220;
  Shader local_218;
  undefined1 local_1b0 [384];
  
  local_220 = (char *)CONCAT44(in_register_00000014,shaderType);
  log = *(TestLog **)(this + 8);
  local_224 = expect;
  glu::Shader::Shader(&local_218,*(RenderContext **)(this + 0x20),(ShaderType)ctx);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_local_buf[0] = '\0';
  glu::Shader::setSources(&local_218,1,&local_220,(int *)&local_224);
  glu::Shader::compile(&local_218);
  glu::operator<<(log,&local_218);
  if (in_R8D == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_248,0,(char *)local_248._M_string_length,0x9a11a8);
    local_218.m_info.compileOk = (bool)(local_218.m_info.compileOk ^ 1);
  }
  else {
    std::__cxx11::string::_M_replace
              ((ulong)&local_248,0,(char *)local_248._M_string_length,0x99df43);
  }
  if (local_218.m_info.compileOk != false) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_248._M_dataplus._M_p,local_248._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    NegativeTestContext::fail((NegativeTestContext *)this,&local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,
                    CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                             local_248.field_2._M_local_buf[0]) + 1);
  }
  glu::Shader::~Shader(&local_218);
  return;
}

Assistant:

void verifyShader(NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource, ExpectResult expect)
{
	DE_ASSERT(expect >= EXPECT_RESULT_PASS && expect < EXPECT_RESULT_LAST);

	tcu::TestLog&		log			= ctx.getLog();
	bool				testFailed	= false;
	const char* const	source		= shaderSource.c_str();
	const int			length		= (int) shaderSource.size();
	glu::Shader			shader		(ctx.getRenderContext(), shaderType);
	std::string			message;

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;

	if (expect == EXPECT_RESULT_PASS)
	{
		testFailed = !shader.getCompileStatus();
		message = "Shader did not compile.";
	}
	else
	{
		testFailed = shader.getCompileStatus();
		message = "Shader was not expected to compile.";
	}

	if (testFailed)
	{
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
		ctx.fail(message);
	}
}